

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O0

bool deqp::gles2::Functional::compareImages
               (RenderContext *renderCtx,TestLog *log,Surface *ref,Surface *res)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  PixelFormat *this;
  RGBA local_34;
  RGBA local_30;
  RGBA local_2c;
  Surface *pSStack_28;
  RGBA threshold;
  Surface *res_local;
  Surface *ref_local;
  TestLog *log_local;
  RenderContext *renderCtx_local;
  
  pSStack_28 = res;
  iVar2 = (*renderCtx->_vptr_RenderContext[4])();
  this = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar2));
  local_30 = tcu::PixelFormat::getColorThreshold(this);
  tcu::RGBA::RGBA(&local_34,0xf,0xf,0xf,0xf);
  local_2c = tcu::operator+(&local_30,&local_34);
  bVar1 = tcu::pixelThresholdCompare
                    (log,"Result","Image compare result",ref,pSStack_28,&local_2c,COMPARE_LOG_RESULT
                    );
  return bVar1;
}

Assistant:

static bool compareImages (const glu::RenderContext& renderCtx, tcu::TestLog& log, const tcu::Surface& ref, const tcu::Surface& res)
{
	DE_ASSERT(renderCtx.getRenderTarget().getNumSamples() == 0);

	const tcu::RGBA threshold = renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(15,15,15,15);
	return tcu::pixelThresholdCompare(log, "Result", "Image compare result", ref, res, threshold, tcu::COMPARE_LOG_RESULT);
}